

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O1

void __thiscall
icu_63::IndianCalendar::handleComputeFields
          (IndianCalendar *this,int32_t julianDay,UErrorCode *param_2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int32_t iVar12;
  int iVar13;
  double dVar14;
  
  dVar1 = uprv_floor_63((double)julianDay + -0.5);
  dVar1 = dVar1 + 0.5;
  dVar14 = uprv_floor_63((dVar1 + -1721425.5) / 146097.0);
  dVar2 = uprv_floor_63(dVar1 + -1721425.5);
  dVar3 = uprv_floor_63((double)((int)dVar2 % 0x23ab1) / 36524.0);
  dVar2 = uprv_floor_63((double)((int)dVar2 % 0x23ab1));
  dVar4 = uprv_floor_63((double)((int)dVar2 % 0x8eac) / 1461.0);
  dVar2 = uprv_floor_63((double)((int)dVar2 % 0x8eac));
  dVar2 = uprv_floor_63((double)((int)dVar2 % 0x5b5) / 365.0);
  uVar11 = (int)(dVar4 * 4.0 + dVar14 * 400.0 + dVar3 * 100.0 + dVar2) +
           (uint)(dVar3 != 4.0 && dVar2 != 4.0);
  dVar2 = gregorianToJD(uVar11,1,1);
  dVar3 = gregorianToJD(uVar11,3,1);
  dVar14 = 0.0;
  if (dVar3 <= dVar1) {
    if ((uVar11 & 3) == 0) {
      uVar7 = uVar11 * -0x3d70a3d7 + 0x51eb850;
      if ((uVar7 >> 2 | uVar11 * 0x40000000) < 0x28f5c29) {
        dVar14 = *(double *)
                  (&DAT_002fc100 + (ulong)((uVar7 >> 4 | uVar11 * -0x70000000) < 0xa3d70b) * 8);
      }
      else {
        dVar14 = 1.0;
      }
    }
    else {
      dVar14 = 2.0;
    }
  }
  dVar14 = uprv_floor_63((((dVar1 - dVar2) + dVar14) * 12.0 + 373.0) / 367.0);
  gregorianToJD(uVar11,(int)dVar14,1);
  dVar14 = gregorianToJD(uVar11,1,1);
  iVar13 = (int)((double)julianDay - dVar14);
  if (iVar13 < 0x50) {
    uVar7 = uVar11 - 1;
    iVar5 = 0x1e;
    if ((uVar7 & 3) == 0) {
      uVar6 = uVar7 * -0x3d70a3d7 + 0x51eb850;
      iVar5 = 0x1f;
      if ((uVar6 >> 2 | uVar7 * 0x40000000) < 0x28f5c29) {
        iVar5 = ((uVar6 >> 4 | uVar7 * -0x70000000) < 0xa3d70b) + 0x1e;
      }
    }
    iVar12 = uVar11 - 0x4f;
    iVar13 = iVar13 + iVar5 + 0xff;
  }
  else {
    iVar5 = 0x1e;
    if ((uVar11 & 3) == 0) {
      uVar7 = uVar11 * -0x3d70a3d7 + 0x51eb850;
      iVar5 = 0x1f;
      if ((uVar7 >> 2 | uVar11 * 0x40000000) < 0x28f5c29) {
        iVar5 = ((uVar7 >> 4 | uVar11 * -0x70000000) < 0xa3d70b) + 0x1e;
      }
    }
    iVar12 = uVar11 - 0x4e;
    iVar13 = iVar13 + -0x50;
  }
  iVar8 = 0;
  iVar9 = iVar13 - iVar5;
  iVar10 = iVar13;
  if (iVar5 <= iVar13) {
    if (iVar9 < 0x9b) {
      dVar14 = uprv_floor_63((double)(iVar9 / 0x1f));
      iVar8 = (int)dVar14 + 1;
      iVar10 = iVar9 % 0x1f;
    }
    else {
      uVar11 = (iVar9 - 0x9bU) / 0x1e;
      dVar14 = uprv_floor_63((double)uVar11);
      iVar8 = (int)dVar14 + 6;
      iVar10 = ((iVar9 - 0x9bU) / 0x1e) * 2 + uVar11 * -0x20 + iVar9 + -0x9b;
    }
  }
  (this->super_Calendar).fFields[0] = 0;
  (this->super_Calendar).fStamp[0] = 1;
  (this->super_Calendar).fIsSet[0] = '\x01';
  (this->super_Calendar).fFields[0x13] = iVar12;
  (this->super_Calendar).fStamp[0x13] = 1;
  (this->super_Calendar).fIsSet[0x13] = '\x01';
  (this->super_Calendar).fFields[1] = iVar12;
  (this->super_Calendar).fStamp[1] = 1;
  (this->super_Calendar).fStamp[2] = 1;
  (this->super_Calendar).fIsSet[1] = '\x01';
  (this->super_Calendar).fIsSet[2] = '\x01';
  (this->super_Calendar).fFields[2] = iVar8;
  (this->super_Calendar).fFields[5] = iVar10 + 1;
  (this->super_Calendar).fStamp[5] = 1;
  (this->super_Calendar).fStamp[6] = 1;
  (this->super_Calendar).fIsSet[5] = '\x01';
  (this->super_Calendar).fIsSet[6] = '\x01';
  (this->super_Calendar).fFields[6] = iVar13 + 1;
  return;
}

Assistant:

void IndianCalendar::handleComputeFields(int32_t julianDay, UErrorCode&  /* status */) {
    double jdAtStartOfGregYear;
    int32_t leapMonth, IndianYear, yday, IndianMonth, IndianDayOfMonth, mday;
    int32_t gregorianYear;      // Stores gregorian date corresponding to Julian day;
    int32_t gd[3];

    gregorianYear = jdToGregorian(julianDay, gd)[0];          // Gregorian date for Julian day
    IndianYear = gregorianYear - INDIAN_ERA_START;            // Year in Saka era
    jdAtStartOfGregYear = gregorianToJD(gregorianYear, 1, 1); // JD at start of Gregorian year
    yday = (int32_t)(julianDay - jdAtStartOfGregYear);        // Day number in Gregorian year (starting from 0)

    if (yday < INDIAN_YEAR_START) {
        // Day is at the end of the preceding Saka year
        IndianYear -= 1;
        leapMonth = isGregorianLeap(gregorianYear - 1) ? 31 : 30; // Days in leapMonth this year, previous Gregorian year
        yday += leapMonth + (31 * 5) + (30 * 3) + 10;
    } else {
        leapMonth = isGregorianLeap(gregorianYear) ? 31 : 30; // Days in leapMonth this year
        yday -= INDIAN_YEAR_START;
    }

    if (yday < leapMonth) {
        IndianMonth = 0;
        IndianDayOfMonth = yday + 1;
    } else {
        mday = yday - leapMonth;
        if (mday < (31 * 5)) {
            IndianMonth = (int32_t)uprv_floor(mday / 31) + 1;
            IndianDayOfMonth = (mday % 31) + 1;
        } else {
            mday -= 31 * 5;
            IndianMonth = (int32_t)uprv_floor(mday / 30) + 6;
            IndianDayOfMonth = (mday % 30) + 1;
        }
   }

   internalSet(UCAL_ERA, 0);
   internalSet(UCAL_EXTENDED_YEAR, IndianYear);
   internalSet(UCAL_YEAR, IndianYear);
   internalSet(UCAL_MONTH, IndianMonth);
   internalSet(UCAL_DAY_OF_MONTH, IndianDayOfMonth);
   internalSet(UCAL_DAY_OF_YEAR, yday + 1); // yday is 0-based
}